

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_program_query
               (NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  bool bVar2;
  ContextType ctxType;
  mapped_type *pmVar3;
  ProgramSources *pPVar4;
  InternalError *pIVar5;
  allocator<char> local_269;
  GLint data [3];
  FragmentSource fragSource;
  string local_230;
  ComputeSource compSource;
  ShaderProgram invalidComputeProgram;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ProgramSources local_e8;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidComputeProgram,"GLSL_VERSION_STRING",(allocator<char> *)&local_e8);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&invalidComputeProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  data[2] = 0;
  data[0] = 0;
  data[1] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidComputeProgram,"Compute shader that does not link",
             (allocator<char> *)&local_e8);
  NegativeTestContext::beginSection(ctx,(string *)&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragSource,
             "${GLSL_VERSION_STRING}\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nvoid main (void)\n{\n\thighp uint var = -1;\n}\n"
             ,(allocator<char> *)&local_230);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_e8,(string *)&fragSource);
  tcu::StringTemplate::specialize
            ((string *)&invalidComputeProgram,(StringTemplate *)&local_e8,&args);
  glu::ComputeSource::ComputeSource(&compSource,(string *)&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_e8);
  std::__cxx11::string::~string((string *)&fragSource);
  pRVar1 = ctx->m_renderCtx;
  memset(&local_e8,0,0xac);
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_e8._193_8_ = 0;
  pPVar4 = glu::ProgramSources::operator<<(&local_e8,&compSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&invalidComputeProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources(&local_e8);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&invalidComputeProgram);
  if (invalidComputeProgram.m_program.m_info.linkOk == true) {
    pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (pIVar5,"program should not of built",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeComputeTests.cpp"
               ,0x1cd);
    __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,
             "GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly."
             ,(allocator<char> *)&fragSource);
  NegativeTestContext::beginSection(ctx,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,invalidComputeProgram.m_program.m_program,0x8267,data);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram(&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalidComputeProgram,"Compute shader not present",
             (allocator<char> *)&local_e8);
  NegativeTestContext::beginSection(ctx,(string *)&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragSource,
             "${GLSL_VERSION_STRING}\n\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&local_230);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_e8,(string *)&fragSource);
  tcu::StringTemplate::specialize
            ((string *)&invalidComputeProgram,(StringTemplate *)&local_e8,&args);
  glu::VertexSource::VertexSource((VertexSource *)&compSource,(string *)&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_e8);
  std::__cxx11::string::~string((string *)&fragSource);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,
             "${GLSL_VERSION_STRING}\nprecision mediump float;\nlayout(location = 0) out mediump vec4 fragColor;\n\nvoid main (void)\n{\n\tfragColor = vec4(1.0);\n}\n"
             ,&local_269);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&local_e8,&local_230);
  tcu::StringTemplate::specialize
            ((string *)&invalidComputeProgram,(StringTemplate *)&local_e8,&args);
  glu::FragmentSource::FragmentSource(&fragSource,(string *)&invalidComputeProgram);
  std::__cxx11::string::~string((string *)&invalidComputeProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&local_e8);
  std::__cxx11::string::~string((string *)&local_230);
  pRVar1 = ctx->m_renderCtx;
  memset(&local_e8,0,0xac);
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_e8._193_8_ = 0;
  pPVar4 = glu::ProgramSources::operator<<(&local_e8,&compSource.super_ShaderSource);
  pPVar4 = glu::ProgramSources::operator<<(pPVar4,&fragSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&invalidComputeProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources(&local_e8);
  glu::operator<<((ctx->super_CallLogWrapper).m_log,&invalidComputeProgram);
  if (invalidComputeProgram.m_program.m_info.linkOk != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly."
               ,(allocator<char> *)&local_230);
    NegativeTestContext::beginSection(ctx,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    glu::CallLogWrapper::glGetProgramiv
              (&ctx->super_CallLogWrapper,invalidComputeProgram.m_program.m_program,0x8267,data);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
    glu::ShaderProgram::~ShaderProgram(&invalidComputeProgram);
    std::__cxx11::string::~string((string *)&fragSource.super_ShaderSource.source);
    std::__cxx11::string::~string((string *)&compSource.super_ShaderSource.source);
    NegativeTestContext::endSection(ctx);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&args._M_t);
    return;
  }
  pIVar5 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar5,"failed to build program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeComputeTests.cpp"
             ,0x1e2);
  __cxa_throw(pIVar5,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void invalid_program_query (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	GLint data[3] = { 0, 0, 0 };

	ctx.beginSection("Compute shader that does not link");
	{
		const glu::ComputeSource	compSource(tcu::StringTemplate(invalidComputeShaderSource).specialize(args));
		glu::ShaderProgram			invalidComputeProgram (ctx.getRenderContext(), glu::ProgramSources() << compSource);

		tcu::TestLog& log = ctx.getLog();
		log << invalidComputeProgram;

		if (invalidComputeProgram.isOk())
			TCU_THROW(InternalError, "program should not of built");

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly.");
		ctx.glGetProgramiv(invalidComputeProgram.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, &data[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
	ctx.endSection();

	ctx.beginSection("Compute shader not present");
	{
		const glu::VertexSource		vertSource(tcu::StringTemplate(vertexShaderSource).specialize(args));
		const glu::FragmentSource	fragSource(tcu::StringTemplate(fragmentShaderSource).specialize(args));
		glu::ShaderProgram			graphicsPipelineProgram	(ctx.getRenderContext(), glu::ProgramSources() << vertSource << fragSource);

		tcu::TestLog& log = ctx.getLog();
		log << graphicsPipelineProgram;

		if (!graphicsPipelineProgram.isOk())
			TCU_THROW(InternalError, "failed to build program");

		ctx.beginSection("GL_INVALID_OPERATION is generated if GL_COMPUTE_WORK_GROUP_SIZE is queried for a program which has not been linked properly.");
		ctx.glGetProgramiv(graphicsPipelineProgram.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, &data[0]);
		ctx.expectError(GL_INVALID_OPERATION);
		ctx.endSection();

		ctx.glUseProgram(0);
	}
	ctx.endSection();
}